

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  int iVar1;
  Table *pTVar2;
  uint local_3c;
  uint local_34;
  int j;
  int i;
  Table *p;
  char *zDatabase_local;
  char *zName_local;
  sqlite3 *db_local;
  
  zDatabase_local = zName;
  do {
    for (local_34 = 0; (int)local_34 < db->nDb; local_34 = local_34 + 1) {
      if ((int)local_34 < 2) {
        local_3c = local_34 ^ 1;
      }
      else {
        local_3c = local_34;
      }
      if (((zDatabase == (char *)0x0) ||
          (iVar1 = sqlite3StrICmp(zDatabase,db->aDb[(int)local_3c].zDbSName), iVar1 == 0)) &&
         (pTVar2 = (Table *)sqlite3HashFind(&(db->aDb[(int)local_3c].pSchema)->tblHash,
                                            zDatabase_local), pTVar2 != (Table *)0x0)) {
        return pTVar2;
      }
    }
    iVar1 = sqlite3StrICmp(zDatabase_local,"sqlite_master");
    if ((iVar1 != 0) || (iVar1 = sqlite3_stricmp(zDatabase,db->aDb[1].zDbSName), iVar1 != 0)) {
      return (Table *)0x0;
    }
    zDatabase_local = "sqlite_temp_master";
  } while( true );
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}